

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

float * stbi__hdr_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  bool bVar1;
  stbi_uc sVar2;
  stbi_uc sVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint a;
  long lVar7;
  stbi_uc local_4a0;
  stbi_uc local_49f;
  byte local_49e;
  stbi_uc local_49d;
  int nleft;
  stbi_uc rgbe_1 [4];
  stbi_uc rgbe [4];
  char *headerToken;
  int z;
  int c2;
  int c1;
  int k;
  int j;
  int i;
  uchar value;
  uchar count;
  int len;
  float *hdr_data;
  stbi_uc *scanline;
  int height;
  int width;
  int valid;
  char *token;
  char buffer [1024];
  stbi__result_info *ri_local;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  bVar1 = false;
  _rgbe_1 = stbi__hdr_gettoken(s,(char *)&token);
  iVar5 = strcmp(_rgbe_1,"#?RADIANCE");
  if ((iVar5 == 0) || (iVar5 = strcmp(_rgbe_1,"#?RGBE"), iVar5 == 0)) {
    while (_width = stbi__hdr_gettoken(s,(char *)&token), *_width != '\0') {
      iVar5 = strcmp(_width,"FORMAT=32-bit_rle_rgbe");
      if (iVar5 == 0) {
        bVar1 = true;
      }
    }
    if (bVar1) {
      _width = stbi__hdr_gettoken(s,(char *)&token);
      iVar5 = strncmp(_width,"-Y ",3);
      if (iVar5 == 0) {
        _width = _width + 3;
        lVar7 = strtol(_width,(char **)&width,10);
        iVar5 = (int)lVar7;
        for (; *_width == ' '; _width = _width + 1) {
        }
        iVar6 = strncmp(_width,"+X ",3);
        if (iVar6 == 0) {
          _width = _width + 3;
          lVar7 = strtol(_width,(char **)0x0,10);
          a = (uint)lVar7;
          if (iVar5 < 0x1000001) {
            if ((int)a < 0x1000001) {
              *x = a;
              *y = iVar5;
              if (comp != (int *)0x0) {
                *comp = 3;
              }
              ri_local._4_4_ = req_comp;
              if (req_comp == 0) {
                ri_local._4_4_ = 3;
              }
              iVar6 = stbi__mad4sizes_valid(a,iVar5,ri_local._4_4_,4,0);
              if (iVar6 == 0) {
                stbi__err("too large");
                s_local = (stbi__context *)0x0;
              }
              else {
                s_local = (stbi__context *)stbi__malloc_mad4(a,iVar5,ri_local._4_4_,4,0);
                if (s_local == (stbi__context *)0x0) {
                  stbi__err("outofmem");
                  s_local = (stbi__context *)0x0;
                }
                else {
                  if (((int)a < 8) || (0x7fff < (int)a)) {
                    c1 = 0;
                    goto LAB_001143fb;
                  }
                  hdr_data = (float *)0x0;
                  for (c1 = 0; c1 < iVar5; c1 = c1 + 1) {
                    sVar2 = stbi__get8(s);
                    sVar3 = stbi__get8(s);
                    bVar4 = stbi__get8(s);
                    if (((sVar2 != '\x02') || (sVar3 != '\x02')) || ((bVar4 & 0x80) != 0)) {
                      local_4a0 = sVar2;
                      local_49f = sVar3;
                      local_49e = bVar4;
                      local_49d = stbi__get8(s);
                      stbi__hdr_convert((float *)s_local,&local_4a0,ri_local._4_4_);
                      k = 1;
                      c1 = 0;
                      free(hdr_data);
                      do {
                        stbi__getn(s,(stbi_uc *)&nleft,4);
                        stbi__hdr_convert((float *)(s_local->buffer_start +
                                                   (long)(k * ri_local._4_4_) * 4 +
                                                   (long)(int)(c1 * a * ri_local._4_4_) * 4 + -0x38)
                                          ,(stbi_uc *)&nleft,ri_local._4_4_);
                        k = k + 1;
                        while ((int)a <= k) {
                          c1 = c1 + 1;
LAB_001143fb:
                          if (iVar5 <= c1) {
                            return (float *)s_local;
                          }
                          k = 0;
                        }
                      } while( true );
                    }
                    sVar2 = stbi__get8(s);
                    if (CONCAT11(bVar4,sVar2) != a) {
                      free(s_local);
                      free(hdr_data);
                      stbi__err("invalid decoded scanline length");
                      return (float *)0x0;
                    }
                    if ((hdr_data == (float *)0x0) &&
                       (hdr_data = (float *)stbi__malloc_mad2(a,4,0), hdr_data == (float *)0x0)) {
                      free(s_local);
                      stbi__err("outofmem");
                      return (float *)0x0;
                    }
                    for (c2 = 0; c2 < 4; c2 = c2 + 1) {
                      k = 0;
                      while (iVar6 = a - k, 0 < iVar6) {
                        bVar4 = stbi__get8(s);
                        if (bVar4 < 0x81) {
                          if (iVar6 < (int)(uint)bVar4) {
                            free(s_local);
                            free(hdr_data);
                            stbi__err("corrupt");
                            return (float *)0x0;
                          }
                          for (headerToken._0_4_ = 0; (int)headerToken < (int)(uint)bVar4;
                              headerToken._0_4_ = (int)headerToken + 1) {
                            sVar2 = stbi__get8(s);
                            *(stbi_uc *)((long)hdr_data + (long)(k * 4 + c2)) = sVar2;
                            k = k + 1;
                          }
                        }
                        else {
                          sVar2 = stbi__get8(s);
                          if (iVar6 < (int)(uint)(byte)(bVar4 + 0x80)) {
                            free(s_local);
                            free(hdr_data);
                            stbi__err("corrupt");
                            return (float *)0x0;
                          }
                          for (headerToken._0_4_ = 0;
                              (int)headerToken < (int)(uint)(byte)(bVar4 + 0x80);
                              headerToken._0_4_ = (int)headerToken + 1) {
                            *(stbi_uc *)((long)hdr_data + (long)(k * 4 + c2)) = sVar2;
                            k = k + 1;
                          }
                        }
                      }
                    }
                    for (k = 0; k < (int)a; k = k + 1) {
                      stbi__hdr_convert((float *)(s_local->buffer_start +
                                                 (long)(int)((c1 * a + k) * ri_local._4_4_) * 4 +
                                                 -0x38),(stbi_uc *)((long)hdr_data + (long)(k << 2))
                                        ,ri_local._4_4_);
                    }
                  }
                  if (hdr_data != (float *)0x0) {
                    free(hdr_data);
                  }
                }
              }
            }
            else {
              stbi__err("too large");
              s_local = (stbi__context *)0x0;
            }
          }
          else {
            stbi__err("too large");
            s_local = (stbi__context *)0x0;
          }
        }
        else {
          stbi__err("unsupported data layout");
          s_local = (stbi__context *)0x0;
        }
      }
      else {
        stbi__err("unsupported data layout");
        s_local = (stbi__context *)0x0;
      }
    }
    else {
      stbi__err("unsupported format");
      s_local = (stbi__context *)0x0;
    }
  }
  else {
    stbi__err("not HDR");
    s_local = (stbi__context *)0x0;
  }
  return (float *)s_local;
}

Assistant:

static float *stbi__hdr_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int width, height;
   stbi_uc *scanline;
   float *hdr_data;
   int len;
   unsigned char count, value;
   int i, j, k, c1,c2, z;
   const char *headerToken;
   STBI_NOTUSED(ri);

   // Check identifier
   headerToken = stbi__hdr_gettoken(s,buffer);
   if (strcmp(headerToken, "#?RADIANCE") != 0 && strcmp(headerToken, "#?RGBE") != 0)
      return stbi__errpf("not HDR", "Corrupt HDR image");

   // Parse header
   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid)    return stbi__errpf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = (int) strtol(token, NULL, 10);

   if (height > STBI_MAX_DIMENSIONS) return stbi__errpf("too large","Very large image (corrupt?)");
   if (width > STBI_MAX_DIMENSIONS) return stbi__errpf("too large","Very large image (corrupt?)");

   *x = width;
   *y = height;

   if (comp) *comp = 3;
   if (req_comp == 0) req_comp = 3;

   if (!stbi__mad4sizes_valid(width, height, req_comp, sizeof(float), 0))
      return stbi__errpf("too large", "HDR image is too large");

   // Read data
   hdr_data = (float *) stbi__malloc_mad4(width, height, req_comp, sizeof(float), 0);
   if (!hdr_data)
      return stbi__errpf("outofmem", "Out of memory");

   // Load image data
   // image data is stored as some number of sca
   if ( width < 8 || width >= 32768) {
      // Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            stbi__getn(s, rgbe, 4);
            stbi__hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
   } else {
      // Read RLE-encoded data
      scanline = NULL;

      for (j = 0; j < height; ++j) {
         c1 = stbi__get8(s);
         c2 = stbi__get8(s);
         len = stbi__get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4];
            rgbe[0] = (stbi_uc) c1;
            rgbe[1] = (stbi_uc) c2;
            rgbe[2] = (stbi_uc) len;
            rgbe[3] = (stbi_uc) stbi__get8(s);
            stbi__hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            STBI_FREE(scanline);
            goto main_decode_loop; // yes, this makes no sense
         }
         len <<= 8;
         len |= stbi__get8(s);
         if (len != width) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) {
            scanline = (stbi_uc *) stbi__malloc_mad2(width, 4, 0);
            if (!scanline) {
               STBI_FREE(hdr_data);
               return stbi__errpf("outofmem", "Out of memory");
            }
         }

         for (k = 0; k < 4; ++k) {
            int nleft;
            i = 0;
            while ((nleft = width - i) > 0) {
               count = stbi__get8(s);
               if (count > 128) {
                  // Run
                  value = stbi__get8(s);
                  count -= 128;
                  if (count > nleft) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = value;
               } else {
                  // Dump
                  if (count > nleft) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = stbi__get8(s);
               }
            }
         }
         for (i=0; i < width; ++i)
            stbi__hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
      }
      if (scanline)
         STBI_FREE(scanline);
   }

   return hdr_data;
}